

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

File * File::parse_file_binary(File *__return_storage_ptr__,ifstream *in)

{
  variant<std::__cxx11::string,int,double> *this;
  pointer pIVar1;
  void *pvVar2;
  File *pFVar3;
  u2 uVar4;
  u2 uVar5;
  u4 uVar6;
  int iVar7;
  size_t sVar8;
  variant_alternative_t<0UL,_variant<basic_string<char>,_int,_double>_> *pvVar9;
  undefined8 *puVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  uint uVar14;
  short sVar15;
  uint uVar16;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  Instruction IVar17;
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> start;
  size_t pos;
  vector<vm::Function,_std::allocator<vm::Function>_> functions;
  Constant constant;
  vector<vm::Constant,_std::allocator<vm::Constant>_> constants;
  size_type bufferSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  anon_class_24_3_d3a0271c read2bytes;
  anon_class_24_3_94a76bc3 readInstruction;
  anon_class_24_3_d3a0271c read4bytes;
  anon_class_24_3_d3a0271c readByte;
  undefined8 uStack_280;
  undefined1 local_278 [20];
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  size_t local_250;
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  undefined1 local_220 [8];
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
  local_218;
  byte local_1f8;
  u4 local_1f0;
  uint local_1ec;
  vector<vm::Constant,_std::allocator<vm::Constant>_> local_1e8;
  Instruction local_1d0;
  ulong local_1c0;
  void *local_1b8;
  long local_1b0;
  long local_1a8;
  uint *local_1a0;
  undefined8 local_198;
  uint local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  uint *local_180;
  undefined8 local_178;
  uint local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  uint *local_160;
  undefined8 local_158;
  uint local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  uint *local_140;
  undefined8 local_138;
  uint local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  uint *local_120;
  undefined8 local_118;
  uint local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  uint *local_100;
  undefined8 local_f8;
  uint local_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  File *local_e0;
  anon_class_24_3_d3a0271c local_d8;
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> local_c0;
  anon_class_24_3_94a76bc3 local_a8;
  vector<vm::Function,_std::allocator<vm::Function>_> local_90;
  vector<vm::Constant,_std::allocator<vm::Constant>_> local_78;
  anon_class_24_3_d3a0271c local_60;
  anon_class_24_3_d3a0271c local_48;
  
  uStack_280 = (undefined *)0x1108d3;
  __first._8_8_ = 0xffffffff;
  __first._M_sbuf = *(streambuf_type **)(in + *(long *)(*(long *)in + -0x18) + 0xe8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1b8,__first,
             (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
             (allocator_type *)local_220);
  local_d8.pos = &local_250;
  local_250 = 0;
  local_1c0 = local_1b0 - (long)local_1b8;
  local_d8.bufferSize = &local_1c0;
  local_a8.readByte = &local_48;
  local_a8.read2bytes = &local_d8;
  local_a8.read4bytes = &local_60;
  uStack_280 = (undefined *)0x110947;
  local_d8.buffer = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b8;
  local_60.pos = local_d8.pos;
  local_60.bufferSize = local_d8.bufferSize;
  local_60.buffer = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b8;
  local_48.pos = local_d8.pos;
  local_48.bufferSize = local_d8.bufferSize;
  local_48.buffer = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1b8;
  uVar6 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(local_a8.read4bytes);
  if (uVar6 != 0x43303a29) {
    uStack_280 = (undefined *)0x111244;
    puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
    uStack_280 = (undefined *)0x11126e;
    local_100 = &local_f0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_100,"invalid binary file: invalid magic","");
    *puVar10 = &PTR__InvalidFile_001247e8;
    puVar10[1] = puVar10 + 3;
    if (local_100 == &local_f0) {
      *(uint *)(puVar10 + 3) = local_f0;
      *(undefined4 *)((long)puVar10 + 0x1c) = uStack_ec;
      *(undefined4 *)(puVar10 + 4) = uStack_e8;
      *(undefined4 *)((long)puVar10 + 0x24) = uStack_e4;
    }
    else {
      puVar10[1] = local_100;
      puVar10[3] = CONCAT44(uStack_ec,local_f0);
    }
    puVar10[2] = local_f8;
    local_f8 = 0;
    local_f0 = local_f0 & 0xffffff00;
    uStack_280 = &UNK_001113a7;
    local_100 = &local_f0;
    __cxa_throw(puVar10,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
  }
  uStack_280 = (undefined *)0x11095f;
  local_1f0 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_60);
  uStack_280 = (undefined *)0x11097b;
  local_e0 = __return_storage_ptr__;
  uVar4 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_d8);
  local_1e8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (uVar4 != 0) {
    this = (variant<std::__cxx11::string,int,double> *)(local_220 + 8);
    uVar14 = 0;
    do {
      local_218._M_rest = (_Variadic_union<int,_double>)((long)local_220 + 0x18);
      local_218._8_8_ = (Instruction *)0x0;
      local_218._16_8_ = local_218._16_8_ & 0xffffffffffffff00;
      local_1f8 = 0;
      uStack_280 = (undefined *)0x1109d8;
      local_220[0] = (allocator_type)
                     parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_48);
      if (local_220[0] == (allocator_type)0x0) {
        uStack_280 = (undefined *)0x110a79;
        uVar5 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_d8);
        if (local_1c0 < uVar5 + local_250) {
          uStack_280 = (undefined *)0x1110b5;
          puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
          pIVar1 = (pointer)(local_278 + 0x10);
          uStack_280 = (undefined *)0x1110d7;
          local_278._0_8_ = pIVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_278,"invalid binary file: incomplete string constant","");
          *puVar10 = &PTR__InvalidFile_001247e8;
          puVar10[1] = puVar10 + 3;
          if ((pointer)local_278._0_8_ == pIVar1) {
            *(undefined4 *)(puVar10 + 3) = local_278._16_4_;
            *(undefined4 *)((long)puVar10 + 0x1c) = uStack_264;
            *(undefined4 *)(puVar10 + 4) = uStack_260;
            *(undefined4 *)((long)puVar10 + 0x24) = uStack_25c;
          }
          else {
            puVar10[1] = local_278._0_8_;
            puVar10[3] = stack0xfffffffffffffd98;
          }
          puVar10[2] = local_278._8_8_;
          local_278._8_8_ = (pointer)0x0;
          stack0xfffffffffffffd98 = (pointer)((ulong)stack0xfffffffffffffd98 & 0xffffffffffffff00);
          uStack_280 = (undefined *)0x11123a;
          local_278._0_8_ = pIVar1;
          __cxa_throw(puVar10,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
        }
        local_248._0_8_ = local_248 + 0x10;
        local_248._8_8_ = (pointer)0x0;
        local_238._M_allocated_capacity = local_238._M_allocated_capacity & 0xffffffffffffff00;
        sVar15 = uVar5 + 1;
        while (sVar15 = sVar15 + -1, sVar15 != 0) {
          local_250 = local_250 + 1;
          uStack_280 = (undefined *)0x110ad5;
          std::__cxx11::string::push_back
                    ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_248);
        }
        uStack_280 = (undefined *)0x110ae2;
        std::variant<std::__cxx11::string,int,double>::operator=
                  (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_248);
        if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
          uStack_280 = (undefined *)0x110afe;
          operator_delete((void *)local_248._0_8_,local_238._M_allocated_capacity + 1);
        }
      }
      else if (local_220[0] == (allocator_type)0x1) {
        uStack_280 = (undefined *)0x110a59;
        uVar6 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_60);
        local_278._0_4_ = uVar6;
        uStack_280 = (undefined *)0x110a67;
        std::variant<std::__cxx11::string,int,double>::operator=(this,(int *)local_278);
      }
      else {
        if (local_220[0] != (allocator_type)0x2) {
          uStack_280 = (undefined *)0x110ff5;
          puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
          uStack_280 = (undefined *)0x11101f;
          local_120 = &local_110;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_120,"invalid binary file: invalid constant type","");
          *puVar10 = &PTR__InvalidFile_001247e8;
          puVar10[1] = puVar10 + 3;
          if (local_120 == &local_110) {
            *(uint *)(puVar10 + 3) = local_110;
            *(undefined4 *)((long)puVar10 + 0x1c) = uStack_10c;
            *(undefined4 *)(puVar10 + 4) = uStack_108;
            *(undefined4 *)((long)puVar10 + 0x24) = uStack_104;
          }
          else {
            puVar10[1] = local_120;
            puVar10[3] = CONCAT44(uStack_10c,local_110);
          }
          puVar10[2] = local_118;
          local_118 = 0;
          local_110 = local_110 & 0xffffff00;
          uStack_280 = &UNK_001111b9;
          local_120 = &local_110;
          __cxa_throw(puVar10,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
        }
        if (local_1c0 < local_250 + 8) {
          uStack_280 = (undefined *)0x11105b;
          puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
          pIVar1 = (pointer)(local_278 + 0x10);
          uStack_280 = (undefined *)0x11107d;
          local_278._0_8_ = pIVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_278,"invalid binary file: incomplete double constant","");
          *puVar10 = &PTR__InvalidFile_001247e8;
          puVar10[1] = puVar10 + 3;
          if ((pointer)local_278._0_8_ == pIVar1) {
            *(undefined4 *)(puVar10 + 3) = local_278._16_4_;
            *(undefined4 *)((long)puVar10 + 0x1c) = uStack_264;
            *(undefined4 *)(puVar10 + 4) = uStack_260;
            *(undefined4 *)((long)puVar10 + 0x24) = uStack_25c;
          }
          else {
            puVar10[1] = local_278._0_8_;
            puVar10[3] = stack0xfffffffffffffd98;
          }
          puVar10[2] = local_278._8_8_;
          local_278._8_8_ = (pointer)0x0;
          stack0xfffffffffffffd98 = (pointer)((ulong)stack0xfffffffffffffd98 & 0xffffffffffffff00);
          uStack_280 = (undefined *)0x1111fc;
          local_278._0_8_ = pIVar1;
          __cxa_throw(puVar10,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
        }
        lVar11 = 8;
        sVar8 = local_250;
        do {
          local_250 = sVar8 + 1;
          *(undefined1 *)((long)&uStack_280 + lVar11 + 7) = *(undefined1 *)((long)local_1b8 + sVar8)
          ;
          lVar11 = lVar11 + -1;
          sVar8 = local_250;
        } while (lVar11 != 0);
        local_248._0_8_ = local_278._0_8_;
        uStack_280 = (undefined *)0x110a47;
        std::variant<std::__cxx11::string,int,double>::operator=(this,(double *)local_248);
      }
      uStack_280 = (undefined *)0x110b10;
      std::vector<vm::Constant,_std::allocator<vm::Constant>_>::emplace_back<vm::Constant>
                (&local_1e8,(Constant *)local_220);
      uStack_280 = (undefined *)0x110b28;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>_&>
        ::_S_vtable._M_arr[local_1f8]._M_data)
                ((anon_class_1_0_00000001 *)local_278,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                  *)this);
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar4);
  }
  uStack_280 = (undefined *)0x110b41;
  uVar4 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_d8);
  local_278._0_8_ = (pointer)0x0;
  local_278._8_8_ = (Instruction *)0x0;
  stack0xfffffffffffffd98 = (Instruction *)0x0;
  if (uVar4 != 0) {
    uVar14 = (uint)uVar4;
    do {
      uStack_280 = (undefined *)0x110b71;
      IVar17 = parse_file_binary::anon_class_24_3_94a76bc3::operator()(&local_a8);
      local_220[0] = (allocator_type)IVar17.op;
      local_220[1] = IVar17._1_1_;
      local_220._2_2_ = IVar17._2_2_;
      local_220._4_2_ = (undefined2)IVar17.x;
      local_220._6_2_ = IVar17.x._2_2_;
      local_218._M_rest._0_4_ = (undefined4)IVar17.y;
      if ((pointer)local_278._8_8_ == stack0xfffffffffffffd98) {
        uStack_280 = (undefined *)0x110ba8;
        std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::
        _M_realloc_insert<vm::Instruction>
                  ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)local_278,
                   (iterator)local_278._8_8_,(Instruction *)local_220);
      }
      else {
        *(_Uninitialized<int,_true> *)(local_278._8_8_ + 8) = local_218._M_rest._M_first._M_storage;
        *(long *)local_278._8_8_ = IVar17._0_8_;
        local_278._8_8_ = local_278._8_8_ + 0xc;
      }
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  uStack_280 = (undefined *)0x110bb9;
  uVar4 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_d8);
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_238._M_allocated_capacity = 0;
  if (uVar4 != 0) {
    local_1ec = (uint)uVar4;
    uVar14 = 0;
    bVar13 = false;
    do {
      local_218._M_rest._0_4_ = (undefined4)0;
      local_218._4_4_ = 0;
      local_218._8_8_ = (Instruction *)0x0;
      local_218._16_8_ = (Instruction *)0x0;
      uStack_280 = (undefined *)0x110c0e;
      uVar4 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_d8);
      local_220[0] = SUB21(uVar4,0);
      local_220[1] = (undefined1)(uVar4 >> 8);
      uVar12 = ((long)local_1e8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_1e8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
      if (uVar12 < uVar4 || uVar12 - uVar4 == 0) {
        uStack_280 = (undefined *)0x110ef0;
        puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
        uStack_280 = (undefined *)0x110f1a;
        local_140 = &local_130;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_140,"invalid binary file: function name not found","");
        *puVar10 = &PTR__InvalidFile_001247e8;
        puVar10[1] = puVar10 + 3;
        if (local_140 == &local_130) {
          *(uint *)(puVar10 + 3) = local_130;
          *(undefined4 *)((long)puVar10 + 0x1c) = uStack_12c;
          *(undefined4 *)(puVar10 + 4) = uStack_128;
          *(undefined4 *)((long)puVar10 + 0x24) = uStack_124;
        }
        else {
          puVar10[1] = local_140;
          puVar10[3] = CONCAT44(uStack_12c,local_130);
        }
        puVar10[2] = local_138;
        local_138 = 0;
        local_130 = local_130 & 0xffffff00;
        uStack_280 = &LAB_00110fe6;
        local_140 = &local_130;
        __cxa_throw(puVar10,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
      }
      if ((&(local_1e8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
             super__Vector_impl_data._M_start)->type)[(uint)uVar4 * 0x30] != STRING) {
        uStack_280 = (undefined *)0x110e91;
        puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
        uStack_280 = (undefined *)0x110ebb;
        local_160 = &local_150;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_160,"invalid binary file: function name not found","");
        *puVar10 = &PTR__InvalidFile_001247e8;
        puVar10[1] = puVar10 + 3;
        if (local_160 == &local_150) {
          *(uint *)(puVar10 + 3) = local_150;
          *(undefined4 *)((long)puVar10 + 0x1c) = uStack_14c;
          *(undefined4 *)(puVar10 + 4) = uStack_148;
          *(undefined4 *)((long)puVar10 + 0x24) = uStack_144;
        }
        else {
          puVar10[1] = local_160;
          puVar10[3] = CONCAT44(uStack_14c,local_150);
        }
        puVar10[2] = local_158;
        local_158 = 0;
        local_150 = local_150 & 0xffffff00;
        uStack_280 = &UNK_00110f93;
        local_160 = &local_150;
        __cxa_throw(puVar10,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
      }
      uStack_280 = (undefined *)0x110c64;
      pvVar9 = std::get<0ul,std::__cxx11::string,int,double>
                         ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                           *)((long)&((local_1e8.
                                       super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->value).
                                     super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                                     .
                                     super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                     .
                                     super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                     .
                                     super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                     .
                                     super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                     .
                                     super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>
                             + (ulong)((uint)uVar4 * 0x30)));
      uStack_280 = (undefined *)0x110c76;
      iVar7 = std::__cxx11::string::compare((char *)pvVar9);
      if (iVar7 == 0) {
        bVar13 = true;
      }
      uStack_280 = (undefined *)0x110c8b;
      local_220._2_2_ = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_d8);
      uStack_280 = (undefined *)0x110c98;
      local_220._4_2_ = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_d8);
      uStack_280 = (undefined *)0x110ca5;
      uVar4 = parse_file_binary::anon_class_24_3_d3a0271c::operator()(&local_d8);
      if (uVar4 != 0) {
        uVar16 = (uint)uVar4;
        do {
          uStack_280 = (undefined *)0x110cb6;
          local_1d0 = parse_file_binary::anon_class_24_3_94a76bc3::operator()(&local_a8);
          if (local_218._8_8_ == local_218._16_8_) {
            uStack_280 = (undefined *)0x110cfe;
            std::vector<vm::Instruction,_std::allocator<vm::Instruction>_>::
            _M_realloc_insert<vm::Instruction>
                      ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)(local_220 + 8),
                       (iterator)local_218._8_8_,&local_1d0);
          }
          else {
            *(u4 *)(local_218._8_8_ + 8) = local_1d0.y;
            *(undefined8 *)local_218._8_8_ = local_1d0._0_8_;
            local_218._8_8_ = local_218._8_8_ + 0xc;
          }
          uVar16 = uVar16 - 1;
        } while (uVar16 != 0);
      }
      uStack_280 = (undefined *)0x110d12;
      std::vector<vm::Function,_std::allocator<vm::Function>_>::emplace_back<vm::Function>
                ((vector<vm::Function,_std::allocator<vm::Function>_> *)local_248,
                 (Function *)local_220);
      pvVar2 = (void *)CONCAT44(local_218._4_4_,local_218._M_rest._M_first._M_storage);
      if (pvVar2 != (void *)0x0) {
        uStack_280 = (undefined *)0x110d29;
        operator_delete(pvVar2,local_218._16_8_ - (long)pvVar2);
      }
      pFVar3 = local_e0;
      uVar14 = uVar14 + 1;
    } while (uVar14 != local_1ec);
    if (bVar13) {
      if (local_250 == local_1b0 - (long)local_1b8) {
        local_78.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1e8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_78.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1e8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_78.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1e8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_1e8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1e8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1e8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_c0.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_278._0_8_;
        local_c0.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_278._8_8_;
        local_c0.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = stack0xfffffffffffffd98;
        local_278._0_8_ = (pointer)0x0;
        local_278._8_8_ = (pointer)0x0;
        stack0xfffffffffffffd98 = (pointer)0x0;
        local_90.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_248._0_8_;
        local_90.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_248._8_8_;
        local_90.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_238._M_allocated_capacity;
        local_248._0_8_ = (pointer)0x0;
        local_248._8_8_ = (pointer)0x0;
        local_238._M_allocated_capacity = 0;
        uStack_280 = (undefined *)0x110df1;
        File(local_e0,local_1f0,&local_78,&local_c0,&local_90);
        uStack_280 = (undefined *)0x110dfe;
        std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector(&local_90);
        if (local_c0.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          uStack_280 = (undefined *)0x110e1b;
          operator_delete(local_c0.
                          super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_c0.
                                super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c0.
                                super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        uStack_280 = (undefined *)0x110e28;
        std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_78);
        uStack_280 = (undefined *)0x110e32;
        std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector
                  ((vector<vm::Function,_std::allocator<vm::Function>_> *)local_248);
        if ((pointer)local_278._0_8_ != (pointer)0x0) {
          uStack_280 = (undefined *)0x110e48;
          operator_delete((void *)local_278._0_8_,(long)stack0xfffffffffffffd98 - local_278._0_8_);
        }
        uStack_280 = (undefined *)0x110e55;
        std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_1e8);
        if (local_1b8 != (void *)0x0) {
          uStack_280 = (undefined *)0x110e72;
          operator_delete(local_1b8,local_1a8 - (long)local_1b8);
        }
        return pFVar3;
      }
      uStack_280 = (undefined *)0x1112aa;
      puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
      uStack_280 = (undefined *)0x1112d4;
      local_1a0 = &local_190;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a0,"invalid binary file: unused content","");
      *puVar10 = &PTR__InvalidFile_001247e8;
      puVar10[1] = puVar10 + 3;
      if (local_1a0 == &local_190) {
        *(uint *)(puVar10 + 3) = local_190;
        *(undefined4 *)((long)puVar10 + 0x1c) = uStack_18c;
        *(undefined4 *)(puVar10 + 4) = uStack_188;
        *(undefined4 *)((long)puVar10 + 0x24) = uStack_184;
      }
      else {
        puVar10[1] = local_1a0;
        puVar10[3] = CONCAT44(uStack_18c,local_190);
      }
      puVar10[2] = local_198;
      local_198 = 0;
      local_190 = local_190 & 0xffffff00;
      uStack_280 = &LAB_001113f7;
      local_1a0 = &local_190;
      __cxa_throw(puVar10,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
    }
  }
  uStack_280 = (undefined *)0x11110f;
  puVar10 = (undefined8 *)__cxa_allocate_exception(0x28);
  uStack_280 = (undefined *)0x111139;
  local_180 = &local_170;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,"invalid binary file: main() not found","");
  *puVar10 = &PTR__InvalidFile_001247e8;
  puVar10[1] = puVar10 + 3;
  if (local_180 == &local_170) {
    *(uint *)(puVar10 + 3) = local_170;
    *(undefined4 *)((long)puVar10 + 0x1c) = uStack_16c;
    *(undefined4 *)(puVar10 + 4) = uStack_168;
    *(undefined4 *)((long)puVar10 + 0x24) = uStack_164;
  }
  else {
    puVar10[1] = local_180;
    puVar10[3] = CONCAT44(uStack_16c,local_170);
  }
  puVar10[2] = local_178;
  local_178 = 0;
  local_170 = local_170 & 0xffffff00;
  uStack_280 = &UNK_00111354;
  local_180 = &local_170;
  __cxa_throw(puVar10,&InvalidFile::typeinfo,InvalidFile::~InvalidFile);
}

Assistant:

File File::parse_file_binary(std::ifstream& in) {
    // read raw
    const std::vector<unsigned char> buffer(std::istreambuf_iterator<char>(in), {});
    size_t pos = 0;
    const auto bufferSize = buffer.size();
    const auto readByte = [&]() {
        if (pos + 1 > bufferSize) {
            throw InvalidFile("incomplete binary file");
        }
        vm::u1 rtv = static_cast<vm::u1>(buffer[pos]);
        pos += 1;
        return rtv;
    };
    const auto read2bytes = [&] {
        if (pos + 2 > bufferSize) {
            throw InvalidFile("incomplete binary file");
        }
        vm::u2 rtv = static_cast<vm::u2>(
            (buffer[pos] << 8) | buffer[pos+1]
        );
        pos += 2;
        return rtv;
    };
    const auto read4bytes = [&]() {
        if (pos + 4 > bufferSize) {
            throw InvalidFile("incomplete binary file");
        }
        vm::u4 rtv = static_cast<vm::u4>(
            (buffer[pos] << 24) | (buffer[pos+1] << 16) | (buffer[pos+2] << 8) | buffer[pos+3]
        );
        pos += 4;
        return rtv;
    };
    const auto readDouble = [&]() {
        if (pos + 8 > bufferSize) {
            throw InvalidFile("invalid binary file: incomplete double constant");
        }
        union {
            vm::double_t d;
            unsigned char b[8];
        } rtv;
        for (int i = 7; i >= 0; --i) {
            rtv.b[i] = buffer[pos++];
        }
        return rtv.d;
    };
    const auto readString = [&](vm::u2 length) {
        if (pos + length > bufferSize) {
            throw InvalidFile("invalid binary file: incomplete string constant");
        }
        vm::str_t rtv;
        while (length-- ) {
            rtv += buffer[pos++];
        }
        return rtv;
    };
    const auto readInstruction = [&]() {
        vm::Instruction ins;
        ins.op = static_cast<vm::OpCode>(readByte());
        if (vm::nameOfOpCode.count(ins.op) == 0) {
            throw InvalidFile("invalid binary file: invalid opcode");
        }
        if (auto it = vm::paramSizeOfOpCode.find(ins.op); it != vm::paramSizeOfOpCode.end()) {
            auto paramSizes = it->second;
            switch (paramSizes[0]) {
            case 1: ins.x = readByte(); break;
            case 2: ins.x = read2bytes(); break;
            case 4: ins.x = read4bytes(); break;
            default: assert(("unexpected error", false));
            }
            if (paramSizes.size() == 2) {
                ins.y = read4bytes();
            }
        }
        return ins;
    };

    // parse magic
    auto magic = read4bytes(); 
    if (magic != magic_v) {
        throw InvalidFile("invalid binary file: invalid magic");
    }

    // parse version
    auto version = read4bytes(); 

    // parse constants
    auto constantsCount = read2bytes();
    std::vector<vm::Constant> constants;
    for (int j = 0; j < constantsCount; ++j) {
        vm::Constant constant;
        constant.type = static_cast<vm::Constant::Type>(readByte());
        switch (constant.type)
        {
        case vm::Constant::Type::STRING: {
            auto length = read2bytes();
            constant.value = std::move(readString(length));
        } break;
        case vm::Constant::Type::INT: {
            constant.value = static_cast<vm::int_t>(read4bytes());
        } break;
        case vm::Constant::Type::DOUBLE: {
            constant.value = readDouble();
        } break;
        default:
            throw InvalidFile("invalid binary file: invalid constant type");
        }
        constants.push_back(std::move(constant));
    }

    // parse start
    auto instructionsCount = read2bytes();
    std::vector<vm::Instruction> start;
    for (int j = 0; j < instructionsCount; ++j) {
        start.push_back(std::move(readInstruction()));
    }

    // parse functions
    auto functionsCount = read2bytes();
    std::vector<vm::Function> functions;
    bool mainFound = false;
    for (int j = 0; j < functionsCount; ++j) {
        vm::Function fun;
        fun.nameIndex = read2bytes();
        if (fun.nameIndex >= constants.size()) {
            throw InvalidFile("invalid binary file: function name not found");
        }
        if (constants[fun.nameIndex].type != vm::Constant::Type::STRING) {
            throw InvalidFile("invalid binary file: function name not found");
        }
        if (std::get<vm::str_t>(constants[fun.nameIndex].value) == "main") {
            mainFound = true;
        }
        fun.paramSize = read2bytes();
        fun.level = read2bytes();
        auto instructionsCount = read2bytes();
        for (int k = 0; k < instructionsCount; ++k) {
            fun.instructions.push_back(std::move(readInstruction()));
        }
        functions.push_back(std::move(fun));
    }

    if (!mainFound) {
        throw InvalidFile("invalid binary file: main() not found");
    }

    if (pos != buffer.size()) {
        throw InvalidFile("invalid binary file: unused content");
    }

    return File{version, std::move(constants), std::move(start), std::move(functions)};
}